

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePathCommand.cxx
# Opt level: O3

bool anon_unknown.dwarf_bbbac5::HandleNormalPathCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmMakefile *this;
  bool bVar2;
  bool bVar3;
  int iVar4;
  pointer pbVar5;
  string_view value;
  cmCMakePath path;
  string inputPath;
  OutputVariable arguments;
  path local_118;
  path local_f0;
  string local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  OutputVariable local_88;
  
  if ((anonymous_namespace)::
      HandleNormalPathCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
      ::parser == '\0') {
    iVar4 = __cxa_guard_acquire(&(anonymous_namespace)::
                                 HandleNormalPathCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                                 ::parser);
    if (iVar4 != 0) {
      ArgumentParserWithOutputVariable<(anonymous_namespace)::OutputVariable>::
      ArgumentParserWithOutputVariable
                (&HandleNormalPathCommand::parser.
                  super_ArgumentParserWithOutputVariable<(anonymous_namespace)::OutputVariable>);
      __cxa_atexit(CMakePathArgumentParser<(anonymous_namespace)::OutputVariable>::
                   ~CMakePathArgumentParser,&HandleNormalPathCommand::parser,&__dso_handle);
      __cxa_guard_release(&(anonymous_namespace)::
                           HandleNormalPathCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                           ::parser);
    }
  }
  ArgumentParserWithOutputVariable<(anonymous_namespace)::OutputVariable>::Parse<2>
            (&local_88,
             &HandleNormalPathCommand::parser.
              super_ArgumentParserWithOutputVariable<(anonymous_namespace)::OutputVariable>,args);
  bVar2 = ArgumentParser::ParseResult::MaybeReportError
                    (&local_88.super_ParseResult,status->Makefile);
  bVar3 = true;
  if (!bVar2) {
    if (HandleNormalPathCommand::parser.
        super_ArgumentParserWithOutputVariable<(anonymous_namespace)::OutputVariable>.
        super_CMakePathArgumentParser<(anonymous_namespace)::OutputVariable>.Inputs.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        HandleNormalPathCommand::parser.
        super_ArgumentParserWithOutputVariable<(anonymous_namespace)::OutputVariable>.
        super_CMakePathArgumentParser<(anonymous_namespace)::OutputVariable>.Inputs.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      local_c8._M_string_length = 0;
      local_c8.field_2._M_local_buf[0] = '\0';
      local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
      bVar3 = getInputPath((args->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start + 1,status,&local_c8);
      if (bVar3) {
        local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_a8,local_c8._M_dataplus._M_p,
                   local_c8._M_dataplus._M_p + local_c8._M_string_length);
        cmCMakePath::cmCMakePath<std::__cxx11::string,cmCMakePath&>
                  ((cmCMakePath *)&local_118,&local_a8,generic_format);
        cmCMakePath::Normal((cmCMakePath *)&local_f0,(cmCMakePath *)&local_118);
        std::filesystem::__cxx11::path::~path(&local_118);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
          operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
        }
        bVar2 = local_88.Output.
                super__Optional_base<ArgumentParser::NonEmpty<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
                ._M_payload.
                super__Optional_payload<ArgumentParser::NonEmpty<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_false,_false>
                .
                super__Optional_payload_base<ArgumentParser::NonEmpty<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_engaged;
        this = status->Makefile;
        pbVar5 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        paVar1 = &local_118._M_pathname.field_2;
        local_118._M_pathname._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_118,local_f0._M_pathname._M_dataplus._M_p,
                   local_f0._M_pathname._M_dataplus._M_p + local_f0._M_pathname._M_string_length);
        pbVar5 = pbVar5 + 1;
        if (bVar2 != false) {
          pbVar5 = (pointer)&local_88.Output;
        }
        value._M_str = local_118._M_pathname._M_dataplus._M_p;
        value._M_len = local_118._M_pathname._M_string_length;
        cmMakefile::AddDefinition(this,pbVar5,value);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118._M_pathname._M_dataplus._M_p != paVar1) {
          operator_delete(local_118._M_pathname._M_dataplus._M_p,
                          local_118._M_pathname.field_2._M_allocated_capacity + 1);
        }
        std::filesystem::__cxx11::path::~path(&local_f0);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p,
                        CONCAT71(local_c8.field_2._M_allocated_capacity._1_7_,
                                 local_c8.field_2._M_local_buf[0]) + 1);
      }
    }
    else {
      paVar1 = &local_f0._M_pathname.field_2;
      local_f0._M_pathname._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_f0,"NORMAL_PATH called with unexpected arguments.","");
      std::__cxx11::string::_M_assign((string *)&status->Error);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_pathname._M_dataplus._M_p != paVar1) {
        operator_delete(local_f0._M_pathname._M_dataplus._M_p,
                        local_f0._M_pathname.field_2._M_allocated_capacity + 1);
      }
      bVar3 = false;
    }
  }
  if (local_88.Output.
      super__Optional_base<ArgumentParser::NonEmpty<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<ArgumentParser::NonEmpty<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_false,_false>
      .
      super__Optional_payload_base<ArgumentParser::NonEmpty<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_engaged == true) {
    local_88.Output.
    super__Optional_base<ArgumentParser::NonEmpty<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<ArgumentParser::NonEmpty<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_false,_false>
    .
    super__Optional_payload_base<ArgumentParser::NonEmpty<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_engaged = false;
    if (local_88.Output.
        super__Optional_base<ArgumentParser::NonEmpty<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<ArgumentParser::NonEmpty<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_false,_false>
        .
        super__Optional_payload_base<ArgumentParser::NonEmpty<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_payload._M_value.super_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
        ._M_dataplus._M_p !=
        ((pointer)
        ((long)&local_88.Output.
                super__Optional_base<ArgumentParser::NonEmpty<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
                ._M_payload.
                super__Optional_payload<ArgumentParser::NonEmpty<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_false,_false>
        + 0x10U))._M_p) {
      operator_delete((void *)local_88.Output.
                              super__Optional_base<ArgumentParser::NonEmpty<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
                              ._M_payload.
                              super__Optional_payload<ArgumentParser::NonEmpty<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_false,_false>
                              .
                              super__Optional_payload_base<ArgumentParser::NonEmpty<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_payload._M_value.
                              super_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                              ._M_dataplus._M_p,
                      local_88.Output.
                      super__Optional_base<ArgumentParser::NonEmpty<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
                      ._M_payload.
                      super__Optional_payload<ArgumentParser::NonEmpty<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_false,_false>
                      .
                      super__Optional_payload_base<ArgumentParser::NonEmpty<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_payload._16_8_ + 1);
    }
  }
  std::
  _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&local_88);
  return bVar3;
}

Assistant:

bool HandleNormalPathCommand(std::vector<std::string> const& args,
                             cmExecutionStatus& status)
{
  static OutputVariableParser const parser{};

  const auto arguments = parser.Parse(args);

  if (arguments.MaybeReportError(status.GetMakefile())) {
    return true;
  }

  if (!parser.GetInputs().empty()) {
    status.SetError("NORMAL_PATH called with unexpected arguments.");
    return false;
  }

  std::string inputPath;
  if (!getInputPath(args[1], status, inputPath)) {
    return false;
  }

  auto path = cmCMakePath(inputPath).Normal();

  status.GetMakefile().AddDefinition(
    arguments.Output ? *arguments.Output : args[1], path.String());

  return true;
}